

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [2],
          TypedID<(spirv_cross::Types)0> *ts_1,char (*ts_2) [6])

{
  undefined1 local_1118 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_2) [6];
  TypedID<(spirv_cross::Types)0> *ts_local_1;
  char (*ts_local) [2];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_1;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  inner::
  join_helper<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
            ((StringStream<4096UL,_4096UL> *)local_1118,(char (*) [2])this,
             (TypedID<(spirv_cross::Types)0> *)ts,
             (char (*) [6])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1118);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}